

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void fmt::v7::detail::fallback_format<double>(double d,buffer<char> *buf,int *exp10)

{
  char *pcVar1;
  size_t sVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  bigint *lhs2;
  unsigned_long value;
  uint uVar9;
  int exp;
  long lVar10;
  int iVar11;
  bool bVar12;
  bigint lower;
  bigint numerator;
  bigint upper_store;
  bigint denominator;
  bigint *local_318;
  ulong local_310;
  bigint local_2f0;
  bigint local_240;
  bigint local_190;
  bigint local_e0;
  
  local_240.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_240.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_00136d38;
  local_240.bigits_.super_buffer<unsigned_int>.ptr_ = local_240.bigits_.store_;
  local_240.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_240.exp_ = 0;
  local_e0.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_e0.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_00136d38;
  local_e0.bigits_.super_buffer<unsigned_int>.ptr_ = local_e0.bigits_.store_;
  local_e0.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_e0.exp_ = 0;
  local_2f0.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_2f0.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_00136d38;
  local_2f0.bigits_.super_buffer<unsigned_int>.ptr_ = local_2f0.bigits_.store_;
  local_2f0.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_2f0.exp_ = 0;
  local_318 = &local_190;
  local_190.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_190.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_00136d38;
  local_190.bigits_.super_buffer<unsigned_int>.ptr_ = local_190.bigits_.store_;
  local_190.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_190.exp_ = 0;
  uVar8 = (ulong)d & 0xfffffffffffff;
  uVar9 = (uint)((ulong)d >> 0x34) & 0x7ff;
  if (uVar9 == 0) {
    value = uVar8 * 2;
    iVar5 = -0x432;
    iVar11 = 1;
    bVar12 = false;
    local_310 = uVar8;
LAB_001116c4:
    exp = *exp10;
    if (exp < 0) {
      bigint::assign_pow10(&local_240,-exp);
      sVar2 = local_240.bigits_.super_buffer<unsigned_int>.size_;
      if (local_2f0.bigits_.super_buffer<unsigned_int>.capacity_ <
          local_240.bigits_.super_buffer<unsigned_int>.size_) {
        (**local_2f0.bigits_.super_buffer<unsigned_int>._vptr_buffer)
                  (&local_2f0,local_240.bigits_.super_buffer<unsigned_int>.size_);
LAB_00111846:
        local_2f0.bigits_.super_buffer<unsigned_int>.size_ = sVar2;
        memmove(local_2f0.bigits_.super_buffer<unsigned_int>.ptr_,
                local_240.bigits_.super_buffer<unsigned_int>.ptr_,sVar2 << 2);
      }
      else {
        local_2f0.bigits_.super_buffer<unsigned_int>.size_ =
             local_240.bigits_.super_buffer<unsigned_int>.size_;
        if (local_240.bigits_.super_buffer<unsigned_int>.size_ != 0) goto LAB_00111846;
      }
      sVar2 = local_240.bigits_.super_buffer<unsigned_int>.size_;
      local_2f0.exp_ = local_240.exp_;
      if (bVar12) {
        if (local_190.bigits_.super_buffer<unsigned_int>.capacity_ <
            local_240.bigits_.super_buffer<unsigned_int>.size_) {
          (**local_190.bigits_.super_buffer<unsigned_int>._vptr_buffer)
                    (&local_190,local_240.bigits_.super_buffer<unsigned_int>.size_);
LAB_001118b6:
          local_190.bigits_.super_buffer<unsigned_int>.size_ = sVar2;
          memmove(local_190.bigits_.super_buffer<unsigned_int>.ptr_,
                  local_240.bigits_.super_buffer<unsigned_int>.ptr_,sVar2 << 2);
        }
        else {
          local_190.bigits_.super_buffer<unsigned_int>.size_ =
               local_240.bigits_.super_buffer<unsigned_int>.size_;
          if (local_240.bigits_.super_buffer<unsigned_int>.size_ != 0) goto LAB_001118b6;
        }
        local_318 = &local_190;
        local_190.exp_ = local_240.exp_;
        bigint::operator<<=(local_318,1);
      }
      else {
        local_318 = (bigint *)0x0;
      }
      bigint::operator*=(&local_240,value);
      *local_e0.bigits_.super_buffer<unsigned_int>.ptr_ = 1;
      if (local_e0.bigits_.super_buffer<unsigned_int>.capacity_ == 0) {
        (**local_e0.bigits_.super_buffer<unsigned_int>._vptr_buffer)(&local_e0,1);
      }
      local_e0.bigits_.super_buffer<unsigned_int>.size_ = 1;
      local_e0.exp_ = 0;
      bigint::operator<<=(&local_e0,iVar11 - iVar5);
    }
    else {
      uVar8 = 0xffffffffffffffff;
      do {
        uVar7 = uVar8;
        local_240.bigits_.store_[uVar7 + 1] = (uint)value;
        value = value >> 0x20;
        uVar8 = uVar7 + 1;
      } while (value != 0);
      if (0x1f < uVar7 + 1) {
        basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::grow
                  (&local_240.bigits_,uVar7 + 2);
        exp = *exp10;
      }
      local_240.exp_ = 0;
      local_240.bigits_.super_buffer<unsigned_int>.size_ = uVar7 + 2;
      bigint::assign_pow10(&local_e0,exp);
      bigint::operator<<=(&local_e0,iVar11 - iVar5);
      *local_2f0.bigits_.super_buffer<unsigned_int>.ptr_ = 1;
      if (local_2f0.bigits_.super_buffer<unsigned_int>.capacity_ == 0) {
        (**local_2f0.bigits_.super_buffer<unsigned_int>._vptr_buffer)(&local_2f0,1);
      }
      local_2f0.bigits_.super_buffer<unsigned_int>.size_ = 1;
      local_2f0.exp_ = 0;
      if (bVar12) {
        *local_190.bigits_.super_buffer<unsigned_int>.ptr_ = 2;
        if (local_190.bigits_.super_buffer<unsigned_int>.capacity_ == 0) {
          (**local_190.bigits_.super_buffer<unsigned_int>._vptr_buffer)(&local_190,1);
        }
        local_318 = &local_190;
        local_190.bigits_.super_buffer<unsigned_int>.size_ = 1;
        local_190.exp_ = 0;
      }
      else {
        local_318 = (bigint *)0x0;
      }
    }
  }
  else {
    local_310 = uVar8 + 0x10000000000000;
    iVar5 = uVar9 - 0x433;
    bVar12 = uVar9 != 1 && uVar8 == 0;
    iVar11 = bVar12 + 1;
    value = local_310 << (sbyte)iVar11;
    if (uVar9 < 0x433) goto LAB_001116c4;
    uVar7 = 0xffffffffffffffff;
    do {
      uVar6 = uVar7;
      local_240.bigits_.store_[uVar6 + 1] = (uint)value;
      value = value >> 0x20;
      uVar7 = uVar6 + 1;
    } while (value != 0);
    if (0x1f < uVar6 + 1) {
      basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::grow
                (&local_240.bigits_,uVar6 + 2);
    }
    local_240.exp_ = 0;
    local_240.bigits_.super_buffer<unsigned_int>.size_ = uVar6 + 2;
    bigint::operator<<=(&local_240,iVar5);
    *local_2f0.bigits_.super_buffer<unsigned_int>.ptr_ = 1;
    if (local_2f0.bigits_.super_buffer<unsigned_int>.capacity_ == 0) {
      (**local_2f0.bigits_.super_buffer<unsigned_int>._vptr_buffer)(&local_2f0,1);
    }
    local_2f0.bigits_.super_buffer<unsigned_int>.size_ = 1;
    local_2f0.exp_ = 0;
    bigint::operator<<=(&local_2f0,iVar5);
    if (uVar9 != 1 && uVar8 == 0) {
      *local_190.bigits_.super_buffer<unsigned_int>.ptr_ = 1;
      if (local_190.bigits_.super_buffer<unsigned_int>.capacity_ == 0) {
        (**local_190.bigits_.super_buffer<unsigned_int>._vptr_buffer)(&local_190,1);
      }
      local_190.bigits_.super_buffer<unsigned_int>.size_ = 1;
      local_190.exp_ = 0;
      bigint::operator<<=(&local_190,uVar9 - 0x432);
    }
    else {
      local_318 = (bigint *)0x0;
    }
    bigint::assign_pow10(&local_e0,*exp10);
    bigint::operator<<=(&local_e0,1);
  }
  lhs2 = local_318;
  if (local_318 == (bigint *)0x0) {
    lhs2 = &local_2f0;
  }
  pcVar1 = buf->ptr_;
  uVar9 = ~(uint)local_310 & 1;
  lVar10 = 0;
  while( true ) {
    uVar4 = bigint::divmod_assign(&local_240,&local_e0);
    iVar5 = compare(&local_240,&local_2f0);
    iVar11 = add_compare(&local_240,lhs2,&local_e0);
    pcVar1[lVar10] = (char)uVar4 + '0';
    if ((iVar5 < (int)uVar9) || ((int)-uVar9 < iVar11)) break;
    bigint::multiply(&local_240,10);
    bigint::multiply(&local_2f0,10);
    if (local_318 != (bigint *)0x0) {
      bigint::multiply(local_318,10);
    }
    lVar10 = lVar10 + 1;
  }
  if (iVar5 < (int)uVar9) {
    if (iVar11 <= (int)-uVar9) goto LAB_00111a77;
    iVar5 = add_compare(&local_240,&local_240,&local_e0);
    if ((iVar5 < 1) && ((uVar4 & 1) == 0 || iVar5 != 0)) goto LAB_00111a77;
    cVar3 = pcVar1[lVar10] + '\x01';
  }
  else {
    cVar3 = (char)uVar4 + '1';
  }
  pcVar1[lVar10] = cVar3;
LAB_00111a77:
  uVar8 = lVar10 + 1U & 0xffffffff;
  if (buf->capacity_ < uVar8) {
    (**buf->_vptr_buffer)(buf,uVar8);
  }
  buf->size_ = uVar8;
  *exp10 = *exp10 - (int)lVar10;
  bigint::~bigint(&local_190);
  bigint::~bigint(&local_2f0);
  bigint::~bigint(&local_e0);
  bigint::~bigint(&local_240);
  return;
}

Assistant:

void fallback_format(Double d, buffer<char>& buf, int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  fp value;
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  // TODO: handle float
  int shift = value.assign(d) ? 2 : 1;
  uint64_t significand = value.f << shift;
  if (value.e >= 0) {
    numerator.assign(significand);
    numerator <<= value.e;
    lower.assign(1);
    lower <<= value.e;
    if (shift != 1) {
      upper_store.assign(1);
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= 1;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (shift != 1) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= significand;
    denominator.assign(1);
    denominator <<= shift - value.e;
  } else {
    numerator.assign(significand);
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower.assign(1);
    if (shift != 1) {
      upper_store.assign(1ULL << 1);
      upper = &upper_store;
    }
  }
  if (!upper) upper = &lower;
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  bool even = (value.f & 1) == 0;
  int num_digits = 0;
  char* data = buf.data();
  for (;;) {
    int digit = numerator.divmod_assign(denominator);
    bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
    // numerator + upper >[=] pow10:
    bool high = add_compare(numerator, *upper, denominator) + even > 0;
    data[num_digits++] = static_cast<char>('0' + digit);
    if (low || high) {
      if (!low) {
        ++data[num_digits - 1];
      } else if (high) {
        int result = add_compare(numerator, numerator, denominator);
        // Round half to even.
        if (result > 0 || (result == 0 && (digit % 2) != 0))
          ++data[num_digits - 1];
      }
      buf.resize(to_unsigned(num_digits));
      exp10 -= num_digits - 1;
      return;
    }
    numerator *= 10;
    lower *= 10;
    if (upper != &lower) *upper *= 10;
  }
}